

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O0

void __thiscall Rml::ScrollController::UpdateSmoothscroll(ScrollController *this,float dp_ratio)

{
  Vector2<float> rhs;
  code *pcVar1;
  bool bVar2;
  float *pfVar3;
  float fVar4;
  Vector2f rhs_00;
  int local_6c;
  int i;
  Vector2<float> local_5c;
  Vector2<float> local_54;
  Vector2<float> local_4c;
  Vector2f scroll_distance;
  float dt;
  Vector2f velocity;
  Vector2<float> local_1c;
  Vector2f target_delta;
  float dp_ratio_local;
  ScrollController *this_local;
  
  target_delta.x = dp_ratio;
  unique0x1000030e = this;
  if (((this->mode != Smoothscroll) || (this->target == (Element *)0x0)) &&
     (bVar2 = Assert("RMLUI_ASSERT(mode == Mode::Smoothscroll && target)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ScrollController.cpp"
                     ,0xa0), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  rhs.x = (this->smoothscroll_scrolled_distance).x;
  rhs.y = (this->smoothscroll_scrolled_distance).y;
  local_1c = Vector2<float>::operator-(&this->smoothscroll_target_distance,rhs);
  unique0x00012000 = this->smoothscroll_scrolled_distance;
  rhs_00 = CalculateSmoothscrollVelocity(local_1c,unique0x00012000,target_delta.x);
  scroll_distance.x = UpdateTime(this);
  local_5c = Rml::operator*(this->smoothscroll_speed_factor,rhs_00);
  local_54 = Vector2<float>::operator*(&local_5c,scroll_distance.x);
  local_4c = Vector2<float>::Round(&local_54);
  for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
    pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_1c);
    if (pfVar3[local_6c] <= 0.0) {
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_1c);
      if (0.0 < pfVar3[local_6c] || pfVar3[local_6c] == 0.0) {
        pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_4c);
        pfVar3[local_6c] = 0.0;
      }
      else {
        pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_4c);
        fVar4 = Math::Min<float>(pfVar3[local_6c],-1.0);
        pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_1c);
        fVar4 = Math::Max<float>(fVar4,pfVar3[local_6c]);
        pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_4c);
        pfVar3[local_6c] = fVar4;
      }
    }
    else {
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_4c);
      fVar4 = Math::Max<float>(pfVar3[local_6c],1.0);
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_1c);
      fVar4 = Math::Min<float>(fVar4,pfVar3[local_6c]);
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_4c);
      pfVar3[local_6c] = fVar4;
    }
  }
  Vector2<float>::operator+=(&this->smoothscroll_scrolled_distance,local_4c);
  PerformScrollOnTarget(this,local_4c);
  bVar2 = HasSmoothscrollReachedTarget(this);
  if (bVar2) {
    Reset(this);
  }
  return;
}

Assistant:

void ScrollController::UpdateSmoothscroll(float dp_ratio)
{
	RMLUI_ASSERT(mode == Mode::Smoothscroll && target);

	const Vector2f target_delta = Vector2f(smoothscroll_target_distance - smoothscroll_scrolled_distance);
	const Vector2f velocity = CalculateSmoothscrollVelocity(target_delta, smoothscroll_scrolled_distance, dp_ratio);

	const float dt = UpdateTime();
	Vector2f scroll_distance = (smoothscroll_speed_factor * velocity * dt).Round();

	for (int i = 0; i < 2; i++)
	{
		// Ensure minimum scroll speed of 1px/frame, and clamp the distance to the target in case of overshooting
		// integration. As opposed to autoscroll, we don't care about fractional speeds here since we want to be fast.
		if (target_delta[i] > 0.f)
			scroll_distance[i] = Math::Min(Math::Max(scroll_distance[i], 1.f), target_delta[i]);
		else if (target_delta[i] < 0.f)
			scroll_distance[i] = Math::Max(Math::Min(scroll_distance[i], -1.f), target_delta[i]);
		else
			scroll_distance[i] = 0.f;
	}

#if 0
	// Useful debugging output for velocity model tuning.
	Log::Message(Log::LT_INFO, "Scroll  y0 %8.2f   y1 %8.2f   v %8.2f   d %8.2f", smoothscroll_scrolled_distance.y, target_delta.y, velocity.y,
		scroll_distance.y);
#endif

	smoothscroll_scrolled_distance += scroll_distance;
	PerformScrollOnTarget(scroll_distance);

	if (HasSmoothscrollReachedTarget())
		Reset();
}